

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateMembers
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  string_view text;
  bool bVar1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar2;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar3;
  Options *options;
  string_view local_228;
  string_view local_218;
  string_view local_208;
  string_view local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  string_view local_168;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  string local_f8 [8];
  string default_value;
  AlphaNum local_98;
  string local_68;
  undefined1 local_48 [8];
  string property_name;
  AlphaNum *local_20;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  bVar1 = FieldDescriptor::has_presence((this->super_FieldGeneratorBase).descriptor_);
  if (bVar1) {
    pfVar2 = &(this->super_FieldGeneratorBase).variables_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&property_name.field_2 + 8),
               "private readonly static $type_name$ $property_name$DefaultValue = $default_value$;\n\n"
              );
    text._M_str = (char *)local_20;
    text._M_len = property_name.field_2._8_8_;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar2,text);
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)pfVar2,(key_arg<char[14]> *)0xaf8d0a);
    std::__cxx11::string::string((string *)local_48,(string *)pbVar3);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)((long)&default_value.field_2 + 8),"DefaultValue");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_68,(lts_20250127 *)&local_98,(AlphaNum *)((long)&default_value.field_2 + 8),
               local_20);
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[21],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&(this->super_FieldGeneratorBase).variables_,
                        (key_arg<char[21]> *)"default_value_access");
    std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    pfVar2 = &(this->super_FieldGeneratorBase).variables_;
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)pfVar2,(key_arg<char[14]> *)0xb940c7);
    std::__cxx11::string::string(local_f8,(string *)pbVar3);
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[21],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)pfVar2,(key_arg<char[21]> *)"default_value_access");
    std::__cxx11::string::operator=((string *)pbVar3,local_f8);
    std::__cxx11::string::~string(local_f8);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_108,"private $type_name$ $name_def_message$;\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,local_108);
  options = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,options,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"$access_level$ $type_name$ $property_name$ {\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,local_118);
  bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (bVar1) {
    bVar1 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_128,"  get { return $name$_ ?? $default_value_access$; }\n");
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_128);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,
                 "  get { if ($has_field_check$) { return $name$_; } else { return $default_value_access$; } }\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_138);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_148,"  get { return $name$_; }\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_148);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"  set {\n");
  io::Printer::Print<>(printer,local_158);
  if ((this->super_FieldGeneratorBase).presenceIndex_ != -1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_168,"    $set_has_field$;\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_168);
  }
  if ((this->is_value_type & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"    $name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_188);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_178,"    $name$_ = value;\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_178);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"  }\n}\n");
  io::Printer::Print<>(printer,local_198);
  bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a8,
               "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_1a8);
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1b8,"$access_level$ bool Has$property_name$ {\n  get { return ");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_1b8);
    bVar1 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c8,"$name$_ != null; }\n}\n");
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_1c8);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1d8,"$has_field_check$; }\n}\n");
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_1d8);
    }
  }
  bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1e8,
               "/// <summary>Clears the value of the \"$descriptor_name$\" field</summary>\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_1e8);
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f8,"$access_level$ void Clear$property_name$() {\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,local_1f8);
    bVar1 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_208,"  $name$_ = null;\n");
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_208);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_218,"  $clear_has_field$;\n");
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&(this->super_FieldGeneratorBase).variables_,local_218);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_228,"}\n");
    io::Printer::Print<>(printer,local_228);
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateMembers(io::Printer* printer) {
  // Note: in multiple places, this code assumes that all fields
  // that support presence are either nullable, or use a presence field bit.
  // Fields which are oneof members are not generated here; they're generated in PrimitiveOneofFieldGenerator below.
  // Extensions are not generated here either.

  // Explicit presence allows different default values to be specified. These
  // are retained via static fields. They don't particularly need to be, but we
  // don't need to change that. Under implicit presence we don't use static
  // fields for default values and just use the literals instead.
  if (descriptor_->has_presence()) {
    // Note: "private readonly static" isn't as idiomatic as
    // "private static readonly", but changing this now would create a lot of
    // churn in generated code with near-to-zero benefit.
    printer->Print(
      variables_,
      "private readonly static $type_name$ $property_name$DefaultValue = $default_value$;\n\n");
    std::string property_name = variables_["property_name"];
    variables_["default_value_access"] =
        absl::StrCat(property_name, "DefaultValue");
  } else {
    std::string default_value = variables_["default_value"];
    variables_["default_value_access"] = std::move(default_value);
  }

  // Declare the field itself.
  printer->Print(
    variables_,
    "private $type_name$ $name_def_message$;\n");

  WritePropertyDocComment(printer, options(), descriptor_);
  AddPublicMemberAttributes(printer);

  // Most of the work is done in the property:
  // Declare the property itself (the same for all options)
  printer->Print(variables_, "$access_level$ $type_name$ $property_name$ {\n");

  // Specify the "getter", which may need to check for a presence field.
  if (SupportsPresenceApi(descriptor_)) {
    if (IsNullable(descriptor_)) {
      printer->Print(
        variables_,
        "  get { return $name$_ ?? $default_value_access$; }\n");
    } else {
      printer->Print(
        variables_,
        // Note: it's possible that this could be rewritten as a
        // conditional ?: expression, but there's no significant benefit
        // to changing it.
        "  get { if ($has_field_check$) { return $name$_; } else { return $default_value_access$; } }\n");
    }
  } else {
    printer->Print(
      variables_,
      "  get { return $name$_; }\n");
  }

  // Specify the "setter", which may need to set a field bit as well as the
  // value.
  printer->Print("  set {\n");
  if (presenceIndex_ != -1) {
    printer->Print(
      variables_,
      "    $set_has_field$;\n");
  }
  if (is_value_type) {
    printer->Print(
      variables_,
      "    $name$_ = value;\n");
  } else {
    printer->Print(
      variables_,
      "    $name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n");
  }
  printer->Print(
    "  }\n"
    "}\n");

  // The "HasFoo" property, where required.
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(variables_,
      "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return ");
    if (IsNullable(descriptor_)) {
      printer->Print(
        variables_,
        "$name$_ != null; }\n}\n");
    } else {
      printer->Print(
        variables_,
        "$has_field_check$; }\n}\n");
    }
  }

  // The "ClearFoo" method, where required.
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(variables_,
      "/// <summary>Clears the value of the \"$descriptor_name$\" field</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n");
    if (IsNullable(descriptor_)) {
      printer->Print(variables_, "  $name$_ = null;\n");
    } else {
      printer->Print(variables_, "  $clear_has_field$;\n");
    }
    printer->Print("}\n");
  }
}